

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relocs.c
# Opt level: O0

void add_reloc(int sym_id,int section_id,int offset,int relative)

{
  reloc_t *prVar1;
  reloc_t *prVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  reloc_t *new;
  
  prVar2 = (reloc_t *)mmalloc(CONCAT44(in_EDX,in_ECX));
  prVar2->sym_id = in_EDI;
  prVar2->section_id = in_ESI;
  prVar2->offset = in_EDX;
  if (in_ECX == 0) {
    prVar2->flags = 0;
  }
  else {
    prVar2->flags = 1;
  }
  prVar2->next = (reloc_s *)0x0;
  prVar1 = prVar2;
  if (root != (reloc_t *)0x0) {
    cur->next = prVar2;
    prVar1 = root;
  }
  root = prVar1;
  cur = prVar2;
  relocs_count = relocs_count + 1;
  return;
}

Assistant:

void add_reloc(int sym_id, int section_id, int offset, int relative)
{
    reloc_t* new = (reloc_t*)mmalloc(sizeof(reloc_t));
    new->sym_id = sym_id;
    new->section_id = section_id;
    new->offset = offset;
    if (relative)
        new->flags = 1;
    else
        new->flags = 0;
    new->next = NULL;
    
    if (root == NULL)
    {
        root = new;
        cur = root;
    }
    else
    {
        cur->next = new;
        cur = new;
    }
        
    ++relocs_count;
}